

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slider.cpp
# Opt level: O1

void __thiscall QtMWidgets::Slider::mousePressEvent(Slider *this,QMouseEvent *e)

{
  SliderPrivate *this_00;
  bool bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  SliderAction SVar6;
  double dVar7;
  double in_XMM1_Qa;
  QRect hr;
  QRect local_58;
  double local_48;
  double local_38;
  undefined8 local_28;
  
  iVar3 = QAbstractSlider::maximum();
  iVar4 = QAbstractSlider::minimum();
  if (((iVar3 == iVar4) || (*(int *)(e + 0x44) != *(int *)(e + 0x40))) || (*(int *)(e + 0x40) != 1))
  {
    e[0xc] = (QMouseEvent)0x0;
  }
  else {
    e[0xc] = (QMouseEvent)0x1;
    local_58 = SliderPrivate::handleRect((this->d).d);
    dVar7 = (double)QEventPoint::position();
    local_28 = CONCAT44((int)((double)((ulong)in_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000)
                             + in_XMM1_Qa),
                        (int)((double)((ulong)dVar7 & 0x8000000000000000 | 0x3fe0000000000000) +
                             dVar7));
    cVar2 = QRect::contains((QPoint *)&local_58,SUB81(&local_28,0));
    this_00 = (this->d).d;
    SVar6 = (SliderAction)this;
    if (cVar2 == '\0') {
      this_00->pressedControl = SC_ComboBoxFrame;
      local_38 = (double)QEventPoint::position();
      local_48 = in_XMM1_Qa;
      iVar3 = QAbstractSlider::orientation();
      in_XMM1_Qa = local_38;
      if (iVar3 != 1) {
        in_XMM1_Qa = local_48;
      }
      iVar3 = SliderPrivate::pixelPosToRangeValue
                        (this_00,(int)((double)((ulong)in_XMM1_Qa & 0x8000000000000000 |
                                               (ulong)DAT_00181910) + in_XMM1_Qa) +
                                 ((this->d).d)->radius * -2);
      iVar4 = QAbstractSlider::value();
      if (iVar4 < iVar3) {
        iVar3 = 3;
        bVar1 = false;
      }
      else {
        iVar4 = QAbstractSlider::value();
        bVar1 = iVar4 <= iVar3;
        iVar3 = (uint)(iVar3 < iVar4) << 2;
      }
      if (!bVar1) {
        QAbstractSlider::triggerAction(SVar6);
        QAbstractSlider::setRepeatAction(SVar6,iVar3,500);
      }
    }
    else {
      this_00->pressedControl = SC_ComboBoxEditField;
      QAbstractSlider::setRepeatAction(SVar6,0,500);
      QAbstractSlider::triggerAction(SVar6);
      QWidget::update();
    }
    if (((this->d).d)->pressedControl == SC_ComboBoxEditField) {
      dVar7 = (double)QEventPoint::position();
      iVar5 = (int)((double)((ulong)dVar7 & 0x8000000000000000 | 0x3fe0000000000000) + dVar7) -
              local_58.x1;
      iVar3 = (int)((double)((ulong)in_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                   in_XMM1_Qa) - local_58.y1;
      iVar4 = QAbstractSlider::orientation();
      if (iVar4 == 1) {
        iVar3 = iVar5;
      }
      ((this->d).d)->clickOffset = iVar3;
      QAbstractSlider::setRepeatAction(SVar6,0,500);
      QAbstractSlider::setSliderDown(SUB81(this,0));
    }
  }
  return;
}

Assistant:

void
Slider::mousePressEvent( QMouseEvent * e )
{
	if( maximum() == minimum() || ( e->buttons() ^ e->button() ) )
	{
		e->ignore();
		return;
	}

	if( e->button() == Qt::LeftButton )
	{
		e->accept();
		const QRect hr = d->handleRect();

		if( hr.contains( e->pos() ) )
		{
			d->pressedControl = QStyle::SC_SliderHandle;
			setRepeatAction( SliderNoAction );
			triggerAction( SliderMove );
			update();
		}
		else
		{
			d->pressedControl = QStyle::SC_SliderGroove;
			SliderAction action = SliderNoAction;

			const int pressValue =
				d->pixelPosToRangeValue( d->pick( e->pos() ) - 2 * d->radius );

			if( pressValue > value() )
				action = SliderPageStepAdd;
			else if( pressValue < value() )
				action = SliderPageStepSub;
			if( action )
			{
				triggerAction( action );
				setRepeatAction( action );
			}
		}

		if( d->pressedControl == QStyle::SC_SliderHandle )
		{
			d->clickOffset = d->pick( e->pos() - hr.topLeft() );
			setRepeatAction( SliderNoAction );
			setSliderDown( true );
		}
	}
	else
		e->ignore();
}